

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

Expression * __thiscall
wasm::anon_unknown_0::AsyncifyBuilder::makeIncStackPos(AsyncifyBuilder *this,int32_t by)

{
  Name name;
  uint bytes;
  uint align;
  BinaryOp op;
  GlobalGet *ptr;
  Expression *left;
  Const *right;
  Binary *value;
  Literal local_90;
  uintptr_t local_78;
  uintptr_t local_70;
  size_t local_68;
  char *pcStack_60;
  Address local_58 [3];
  uintptr_t local_40;
  undefined1 local_38 [8];
  Literal literal;
  int32_t by_local;
  AsyncifyBuilder *this_local;
  
  literal.type.id._4_4_ = by;
  if (by == 0) {
    this_local = (AsyncifyBuilder *)Builder::makeNop(&this->super_Builder);
  }
  else {
    local_40 = (this->pointerType).id;
    wasm::Literal::makeFromInt64((Literal *)local_38,(long)by,(Type)local_40);
    bytes = wasm::Type::getByteSize(&this->pointerType);
    wasm::Address::Address(local_58,0);
    align = wasm::Type::getByteSize(&this->pointerType);
    local_68 = wasm::(anonymous_namespace)::ASYNCIFY_DATA;
    pcStack_60 = DAT_031935f8;
    local_70 = (this->pointerType).id;
    name.super_IString.str._M_str = DAT_031935f8;
    name.super_IString.str._M_len = wasm::(anonymous_namespace)::ASYNCIFY_DATA;
    ptr = Builder::makeGlobalGet(&this->super_Builder,name,(Type)local_70);
    local_78 = (this->pointerType).id;
    op = Abstract::getBinary((Type)local_78,Add);
    left = makeGetStackPos(this);
    wasm::Literal::Literal(&local_90,(Literal *)local_38);
    right = Builder::makeConst(&this->super_Builder,&local_90);
    value = Builder::makeBinary(&this->super_Builder,op,left,(Expression *)right);
    this_local = (AsyncifyBuilder *)
                 Builder::makeStore(&this->super_Builder,bytes,local_58[0],align,(Expression *)ptr,
                                    (Expression *)value,(Type)(this->pointerType).id,
                                    (Name)(this->asyncifyMemory).super_IString.str);
    wasm::Literal::~Literal(&local_90);
    wasm::Literal::~Literal((Literal *)local_38);
  }
  return (Expression *)this_local;
}

Assistant:

Expression* makeIncStackPos(int32_t by) {
    if (by == 0) {
      return makeNop();
    }
    auto literal = Literal::makeFromInt64(by, pointerType);
    return makeStore(pointerType.getByteSize(),
                     int(DataOffset::BStackPos),
                     pointerType.getByteSize(),
                     makeGlobalGet(ASYNCIFY_DATA, pointerType),
                     makeBinary(Abstract::getBinary(pointerType, Abstract::Add),
                                makeGetStackPos(),
                                makeConst(literal)),
                     pointerType,
                     asyncifyMemory);
  }